

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-exceptions.hpp
# Opt level: O2

void __thiscall helics::RegistrationFailure::~RegistrationFailure(RegistrationFailure *this)

{
  HelicsException::~HelicsException(&this->super_HelicsException);
  operator_delete(this,0x28);
  return;
}

Assistant:

explicit RegistrationFailure(std::string_view message = "registration failure") noexcept:
        HelicsException(message)
    {
    }